

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O2

Var Js::HelperMethodWrapper6
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  AutoRegisterIgnoreExceptionWrapper local_50;
  code *local_48;
  Var local_40;
  Var local_38;
  
  local_38 = arg6;
  local_48 = (code *)origHelperAddr;
  local_40 = arg4;
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x7a,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->threadContext);
  if (bVar2) {
    pvVar4 = (Var)(*local_48)(arg1,arg2,arg3,local_40,arg5,local_38);
    return pvVar4;
  }
  AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
            (&local_50,scriptContext->threadContext);
  pvVar4 = (Var)(*local_48)(arg1,arg2,arg3,local_40,arg5,local_38);
  AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_50);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper6(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod6)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6);
        });
    }